

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O2

void __thiscall FFTAnalyzer::CheckInitialized(FFTAnalyzer *this)

{
  ulong uVar1;
  float *pfVar2;
  UnityComplexNumber *pUVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int n;
  ulong uVar7;
  long lVar8;
  float fVar9;
  
  if (this->window != (float *)0x0) {
    return;
  }
  iVar5 = this->spectrumSize;
  uVar6 = (ulong)iVar5;
  uVar1 = 0xffffffffffffffff;
  uVar4 = uVar6 * 4;
  if ((long)uVar6 < 0) {
    uVar4 = uVar1;
  }
  uVar7 = uVar6 * 8;
  if ((long)uVar6 < 0) {
    uVar7 = uVar1;
  }
  pfVar2 = (float *)operator_new__(uVar4);
  this->window = pfVar2;
  pfVar2 = (float *)operator_new__(uVar4);
  this->ibuffer = pfVar2;
  pfVar2 = (float *)operator_new__(uVar4);
  this->obuffer = pfVar2;
  uVar4 = (long)(iVar5 / 2) << 2;
  if ((long)uVar6 < -1) {
    uVar4 = uVar1;
  }
  pfVar2 = (float *)operator_new__(uVar4);
  this->ispec1 = pfVar2;
  pfVar2 = (float *)operator_new__(uVar4);
  this->ispec2 = pfVar2;
  pfVar2 = (float *)operator_new__(uVar4);
  this->ospec1 = pfVar2;
  pfVar2 = (float *)operator_new__(uVar4);
  this->ospec2 = pfVar2;
  pUVar3 = (UnityComplexNumber *)operator_new__(uVar7);
  this->cspec = pUVar3;
  lVar8 = 0;
  while( true ) {
    iVar5 = (int)uVar6;
    if (iVar5 <= lVar8) break;
    fVar9 = cosf((3.1415927 / (float)iVar5) * (float)(int)lVar8);
    this->window[lVar8] = fVar9 * -0.46 + 0.54;
    lVar8 = lVar8 + 1;
    uVar6 = (ulong)(uint)this->spectrumSize;
  }
  memset(this->ibuffer,0,(long)iVar5 << 2);
  memset(this->obuffer,0,(long)this->spectrumSize << 2);
  memset(this->ispec1,0,(long)(this->spectrumSize / 2) << 2);
  memset(this->ispec2,0,(long)(this->spectrumSize / 2) << 2);
  memset(this->ospec1,0,(long)(this->spectrumSize / 2) << 2);
  memset(this->ospec2,0,(long)(this->spectrumSize / 2) << 2);
  memset(this->cspec,0,(long)this->spectrumSize << 3);
  return;
}

Assistant:

void FFTAnalyzer::CheckInitialized()
{
    if (window == NULL)
    {
        window = new float[spectrumSize];
        ibuffer = new float[spectrumSize];
        obuffer = new float[spectrumSize];
        ispec1 = new float[spectrumSize / 2];
        ispec2 = new float[spectrumSize / 2];
        ospec1 = new float[spectrumSize / 2];
        ospec2 = new float[spectrumSize / 2];
        cspec = new UnityComplexNumber[spectrumSize];
        for (int n = 0; n < spectrumSize; n++)
            window[n] = 0.54f - 0.46f * cosf(n * (kPI / (float)spectrumSize));
        memset(ibuffer, 0, sizeof(float) * spectrumSize);
        memset(obuffer, 0, sizeof(float) * spectrumSize);
        memset(ispec1, 0, sizeof(float) * (spectrumSize / 2));
        memset(ispec2, 0, sizeof(float) * (spectrumSize / 2));
        memset(ospec1, 0, sizeof(float) * (spectrumSize / 2));
        memset(ospec2, 0, sizeof(float) * (spectrumSize / 2));
        memset(cspec, 0, sizeof(UnityComplexNumber) * spectrumSize);
    }
}